

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RandomUniformLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformlike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4a6) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4a6;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    RandomUniformLikeLayerParams::RandomUniformLikeLayerParams(this_00.randomuniformlike_);
    (this->layer_).randomuniformlike_ = (RandomUniformLikeLayerParams *)this_00;
  }
  return (RandomUniformLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformLikeLayerParams* NeuralNetworkLayer::mutable_randomuniformlike() {
  if (!has_randomuniformlike()) {
    clear_layer();
    set_has_randomuniformlike();
    layer_.randomuniformlike_ = new ::CoreML::Specification::RandomUniformLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomUniformLike)
  return layer_.randomuniformlike_;
}